

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

bool __thiscall
miniros::MasterLink::getParamImpl<int>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *map,bool cached)

{
  bool bVar1;
  int iVar2;
  mapped_type_conflict2 *pmVar3;
  _Rb_tree_node_base *p_Var4;
  RpcValue xml_value;
  RpcValue local_48;
  XmlRpcValue local_38;
  
  local_48._type = TypeInvalid;
  local_48._value.asDouble = 0.0;
  bVar1 = getParamImpl(this,key,&local_48,cached);
  if (bVar1 && local_48._type == TypeStruct) {
    XmlRpc::XmlRpcValue::assertStruct(&local_48);
    p_Var4 = *(_Rb_tree_node_base **)&(local_48._value.asTime)->tm_wday;
    while( true ) {
      XmlRpc::XmlRpcValue::assertStruct(&local_48);
      bVar1 = p_Var4 == (_Rb_tree_node_base *)&(local_48._value.asTime)->tm_hour;
      if ((bVar1) || (2 < p_Var4[2]._M_color - _S_black)) break;
      local_38._type = TypeInvalid;
      XmlRpc::XmlRpcValue::operator=(&local_38,(XmlRpcValue *)(p_Var4 + 2));
      iVar2 = xml_cast<int>(&local_38);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](map,(key_type *)(p_Var4 + 1));
      *pmVar3 = iVar2;
      XmlRpc::XmlRpcValue::invalidate(&local_38);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    }
  }
  else {
    bVar1 = false;
  }
  XmlRpc::XmlRpcValue::invalidate(&local_48);
  return bVar1;
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::map<std::string, T>& map, bool cached)
{
  RpcValue xml_value;
  if (!getParamImpl(key, xml_value, cached)) {
    return false;
  }

  // Make sure it's a struct type
  if (xml_value.getType() != RpcValue::TypeStruct) {
    return false;
  }

  // Fill the map with stuff
  for (auto it = xml_value.begin(); it != xml_value.end(); ++it) {
    // Make sure this element is the right type
    if (!xml_castable<T>(it->second.getType())) {
      return false;
    }
    // Store the element
    map[it->first] = xml_cast<T>(it->second);
  }

  return true;
}